

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper.h
# Opt level: O0

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* spdlog::details::file_helper::split_by_extenstion
            (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,filename_t *fname)

{
  size_type sVar1;
  long lVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  ulong local_58;
  size_type folder_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  size_type ext_index;
  filename_t *fname_local;
  
  ext_index = (size_type)fname;
  fname_local = (filename_t *)__return_storage_ptr__;
  lVar2 = std::__cxx11::string::rfind((char)fname,0x2e);
  local_20 = lVar2;
  if (((lVar2 != -1) && (lVar2 != 0)) && (lVar3 = std::__cxx11::string::size(), lVar2 != lVar3 + -1)
     ) {
    local_58 = std::__cxx11::string::rfind((char)ext_index,0x2f);
    sVar1 = ext_index;
    if ((local_58 != 0xffffffffffffffff) && (local_20 - 1U <= local_58)) {
      std::__cxx11::string::string((string *)&local_78);
      std::make_tuple<std::__cxx11::string_const&,std::__cxx11::string>
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar1,
                 &local_78);
      std::__cxx11::string::~string((string *)&local_78);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::substr((ulong)&local_98,ext_index);
    std::__cxx11::string::substr((ulong)&local_b8,ext_index);
    std::make_tuple<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,&local_98,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    return __return_storage_ptr__;
  }
  sVar1 = ext_index;
  std::__cxx11::string::string((string *)&local_40);
  std::make_tuple<std::__cxx11::string_const&,std::__cxx11::string>
            (__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static std::tuple<filename_t, filename_t> split_by_extenstion(const spdlog::filename_t &fname)
    {
        auto ext_index = fname.rfind('.');

        // no valid extension found - return whole path and empty string as
        // extension
        if (ext_index == filename_t::npos || ext_index == 0 || ext_index == fname.size() - 1)
        {
            return std::make_tuple(fname, spdlog::filename_t());
        }

        // treat casese like "/etc/rc.d/somelogfile or "/abc/.hiddenfile"
        auto folder_index = fname.rfind(details::os::folder_sep);
        if (folder_index != filename_t::npos && folder_index >= ext_index - 1)
        {
            return std::make_tuple(fname, spdlog::filename_t());
        }

        // finally - return a valid base and extension tuple
        return std::make_tuple(fname.substr(0, ext_index), fname.substr(ext_index));
    }